

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O1

HomogeneousMedium *
pbrt::HomogeneousMedium::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  RGBColorSpace *pRVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  HomogeneousMedium *pHVar5;
  SpectrumHandle sig_s;
  SpectrumHandle sig_a;
  Float sigScale;
  SpectrumHandle Le;
  string preset;
  Float g;
  string local_c8;
  polymorphic_allocator<std::byte> local_a8;
  Float local_9c;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_98;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_90;
  Float local_84;
  undefined1 local_80 [32];
  undefined1 local_60 [36];
  float local_3c;
  undefined8 local_38;
  _Alloc_hider local_30;
  size_t local_28;
  
  local_90.bits = 0;
  local_98.bits = 0;
  paVar1 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  local_a8.memoryResource = alloc.memoryResource;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"preset","");
  local_80._0_8_ = local_80 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"");
  ParameterDictionary::GetOneString((string *)local_60,parameters,&local_c8,(string *)local_80);
  if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
    operator_delete((void *)local_80._0_8_,
                    (ulong)((long)&(((string *)local_80._16_8_)->_M_dataplus)._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  if ((ParsedParameter *)local_60._8_8_ != (ParsedParameter *)0x0) {
    bVar3 = GetMediumScatteringProperties
                      ((string *)local_60,(SpectrumHandle *)&local_90,(SpectrumHandle *)&local_98,
                       (Allocator)local_a8.memoryResource);
    if (!bVar3) {
      local_c8._M_string_length = 0;
      local_c8.field_2._M_local_buf[0] = '\0';
      local_c8._M_dataplus._M_p = (pointer)paVar1;
      detail::stringPrintfRecursive<std::__cxx11::string&>
                (&local_c8,"Material preset \"%s\" not found.",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      Warning(loc,local_c8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8._M_dataplus._M_p,
                        CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                 local_c8.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  if ((pointer)local_90.bits == (pointer)0x0) {
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"sigma_a","");
    local_28 = 0;
    ParameterDictionary::GetOneSpectrum
              ((ParameterDictionary *)local_80,(string *)parameters,(SpectrumHandle *)&local_c8,
               (SpectrumType)&local_28,(Allocator)0x1);
    local_90.bits = local_80._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,
                      CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                               local_c8.field_2._M_local_buf[0]) + 1);
    }
    pRVar2 = RGBColorSpace::sRGB;
    if ((pointer)local_90.bits == (pointer)0x0) {
      local_c8._M_dataplus._M_p = (pointer)0x3b1d49523a902de0;
      local_c8._M_string_length = CONCAT44(local_c8._M_string_length._4_4_,0x3c656042);
      iVar4 = (*(local_a8.memoryResource)->_vptr_memory_resource[2])(local_a8.memoryResource,0x28,8)
      ;
      RGBSpectrum::RGBSpectrum((RGBSpectrum *)CONCAT44(extraout_var,iVar4),pRVar2,(RGB *)&local_c8);
      local_90.bits = CONCAT44(extraout_var,iVar4) | 0x4000000000000;
    }
  }
  if ((pointer)local_98.bits == (pointer)0x0) {
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"sigma_s","");
    local_30._M_p = (pointer)0x0;
    ParameterDictionary::GetOneSpectrum
              ((ParameterDictionary *)local_80,(string *)parameters,(SpectrumHandle *)&local_c8,
               (SpectrumType)&local_30,(Allocator)0x1);
    local_98.bits = local_80._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,
                      CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                               local_c8.field_2._M_local_buf[0]) + 1);
    }
    pRVar2 = RGBColorSpace::sRGB;
    if ((pointer)local_98.bits == (pointer)0x0) {
      local_c8._M_dataplus._M_p = (pointer)0x404d70a440233333;
      local_c8._M_string_length = CONCAT44(local_c8._M_string_length._4_4_,0x407147ae);
      iVar4 = (*(local_a8.memoryResource)->_vptr_memory_resource[2])(local_a8.memoryResource,0x28,8)
      ;
      RGBSpectrum::RGBSpectrum
                ((RGBSpectrum *)CONCAT44(extraout_var_00,iVar4),pRVar2,(RGB *)&local_c8);
      local_98.bits = CONCAT44(extraout_var_00,iVar4) | 0x4000000000000;
    }
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Le","");
  local_38 = (ParsedParameter *)0x0;
  ParameterDictionary::GetOneSpectrum
            ((ParameterDictionary *)local_80,(string *)parameters,(SpectrumHandle *)&local_c8,
             (SpectrumType)&local_38,(Allocator)0x1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  if ((pointer)local_80._0_8_ == (pointer)0x0) {
    iVar4 = (*(local_a8.memoryResource)->_vptr_memory_resource[2])(local_a8.memoryResource,4,4);
    *(undefined4 *)CONCAT44(extraout_var_01,iVar4) = 0;
    local_80._0_8_ = CONCAT44(extraout_var_01,iVar4) | 0x1000000000000;
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"scale","");
  local_84 = ParameterDictionary::GetOneFloat(parameters,&local_c8,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    local_9c = local_84;
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
    local_84 = local_9c;
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"g","");
  local_3c = ParameterDictionary::GetOneFloat(parameters,&local_c8,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    local_9c = local_3c;
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
    local_3c = local_9c;
  }
  pHVar5 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::HomogeneousMedium,pbrt::SpectrumHandle&,pbrt::SpectrumHandle&,float&,pbrt::SpectrumHandle&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     (&local_a8,(SpectrumHandle *)&local_90,(SpectrumHandle *)&local_98,&local_84,
                      (SpectrumHandle *)local_80,&local_3c,&local_a8);
  if ((ParsedParameter *)local_60._0_8_ != (ParsedParameter *)(local_60 + 0x10)) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  return pHVar5;
}

Assistant:

HomogeneousMedium *HomogeneousMedium::Create(const ParameterDictionary &parameters,
                                             const FileLoc *loc, Allocator alloc) {
    SpectrumHandle sig_a = nullptr, sig_s = nullptr;
    std::string preset = parameters.GetOneString("preset", "");
    if (!preset.empty()) {
        if (!GetMediumScatteringProperties(preset, &sig_a, &sig_s, alloc))
            Warning(loc, "Material preset \"%s\" not found.", preset);
    }
    if (sig_a == nullptr) {
        sig_a =
            parameters.GetOneSpectrum("sigma_a", nullptr, SpectrumType::General, alloc);
        if (sig_a == nullptr)
            sig_a = alloc.new_object<RGBSpectrum>(*RGBColorSpace::sRGB,
                                                  RGB(.0011f, .0024f, .014f));
    }
    if (sig_s == nullptr) {
        sig_s =
            parameters.GetOneSpectrum("sigma_s", nullptr, SpectrumType::General, alloc);
        if (sig_s == nullptr)
            sig_s = alloc.new_object<RGBSpectrum>(*RGBColorSpace::sRGB,
                                                  RGB(2.55f, 3.21f, 3.77f));
    }

    SpectrumHandle Le =
        parameters.GetOneSpectrum("Le", nullptr, SpectrumType::General, alloc);
    if (Le == nullptr)
        Le = alloc.new_object<ConstantSpectrum>(0.f);

    Float sigScale = parameters.GetOneFloat("scale", 1.f);

    Float g = parameters.GetOneFloat("g", 0.0f);

    return alloc.new_object<HomogeneousMedium>(sig_a, sig_s, sigScale, Le, g, alloc);
}